

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall
PeleLM::scalar_advection_update(PeleLM *this,Real dt,int first_scalar,int last_scalar)

{
  long lVar1;
  pointer pSVar2;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_00;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> this_01;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  int n;
  long lVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  bool bVar20;
  Real time;
  Box local_1ac;
  Array4<const_double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter mfi;
  
  time = amrex::StateData::curTime
                   ((this->super_NavierStokesBase).super_AmrLevel.state.
                    super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                    super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                    super__Vector_impl_data._M_start);
  pSVar2 = (this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar2->new_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (pSVar2->old_data)._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  amrex::MFIter::MFIter
            (&mfi,(FabArrayBase *)
                  this_00.
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
  lVar1 = (long)first_scalar * 8;
  while (mfi.currentIndex < mfi.endIndex) {
    amrex::MFIter::tilebox(&local_1ac,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_d0,
               (FabArray<amrex::FArrayBox> *)
               this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_110,
               (FabArray<amrex::FArrayBox> *)
               this_01.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
               super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_150,&((this->super_NavierStokesBase).aofs)->super_FabArray<amrex::FArrayBox>,
               &mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_190,&(this->external_sources).super_FabArray<amrex::FArrayBox>,&mfi);
    lVar18 = (long)local_1ac.smallend.vect[1];
    lVar16 = (long)local_1ac.smallend.vect[2];
    lVar8 = lVar1 * local_d0.nstride +
            (lVar16 - local_d0.begin.z) * local_d0.kstride * 8 +
            (lVar18 - local_d0.begin.y) * local_d0.jstride * 8 + (long)local_d0.begin.x * -8 +
            (long)local_d0.p;
    lVar3 = lVar1 * local_190.nstride +
            (lVar16 - local_190.begin.z) * local_190.kstride * 8 +
            (lVar18 - local_190.begin.y) * local_190.jstride * 8 + (long)local_190.begin.x * -8 +
            (long)local_190.p;
    lVar5 = lVar1 * local_150.nstride +
            (lVar16 - local_150.begin.z) * local_150.kstride * 8 +
            (lVar18 - local_150.begin.y) * local_150.jstride * 8 + (long)local_150.begin.x * -8 +
            (long)local_150.p;
    lVar13 = lVar1 * local_110.nstride +
             (lVar16 - local_110.begin.z) * local_110.kstride * 8 +
             (lVar18 - local_110.begin.y) * local_110.jstride * 8 + (long)local_110.begin.x * -8 +
             (long)local_110.p;
    for (; lVar4 = lVar3, lVar6 = lVar5, lVar9 = lVar8, lVar11 = lVar18, lVar14 = lVar13,
        lVar16 <= local_1ac.bigend.vect[2]; lVar16 = lVar16 + 1) {
      for (; lVar11 <= local_1ac.bigend.vect[1]; lVar11 = lVar11 + 1) {
        iVar10 = local_1ac.smallend.vect[0];
        if (local_1ac.smallend.vect[0] <= local_1ac.bigend.vect[0]) {
          do {
            lVar17 = (long)iVar10;
            pdVar19 = (double *)(lVar9 + lVar17 * 8);
            pdVar15 = (double *)(lVar4 + lVar17 * 8);
            pdVar12 = (double *)(lVar6 + lVar17 * 8);
            pdVar7 = (double *)(lVar14 + lVar17 * 8);
            for (lVar17 = (long)first_scalar; lVar17 <= last_scalar; lVar17 = lVar17 + 1) {
              *pdVar19 = (*pdVar12 + *pdVar15) * dt + *pdVar7;
              pdVar19 = pdVar19 + local_d0.nstride;
              pdVar15 = pdVar15 + local_190.nstride;
              pdVar12 = pdVar12 + local_150.nstride;
              pdVar7 = pdVar7 + local_110.nstride;
            }
            bVar20 = iVar10 != local_1ac.bigend.vect[0];
            iVar10 = iVar10 + 1;
          } while (bVar20);
        }
        lVar4 = lVar4 + local_190.jstride * 8;
        lVar6 = lVar6 + local_150.jstride * 8;
        lVar9 = lVar9 + local_d0.jstride * 8;
        lVar14 = lVar14 + local_110.jstride * 8;
      }
      lVar8 = lVar8 + local_d0.kstride * 8;
      lVar3 = lVar3 + local_190.kstride * 8;
      lVar5 = lVar5 + local_150.kstride * 8;
      lVar13 = lVar13 + local_110.kstride * 8;
    }
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  amrex::AmrLevel::FillPatch
            ((AmrLevel *)this,
             (MultiFab *)
             this_00.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
             ((IntVect *)
             ((long)this_00.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->vect[0],
             time,0,3,1,3);
  return;
}

Assistant:

void
PeleLM::scalar_advection_update (Real dt,
                                 int  first_scalar,
                                 int  last_scalar)
{
   //
   // Careful: If here, the sign of aofs is flipped (wrt the usual NS treatment).
   //
   const Real new_time   = state[State_Type].curTime();
   MultiFab&       S_new = get_new_data(State_Type);
   const MultiFab& S_old = get_old_data(State_Type);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
       const Box& bx   = mfi.tilebox();
       auto const& snew   = S_new.array(mfi);
       auto const& sold   = S_old.const_array(mfi);
       auto const& adv    = aofs->const_array(mfi);
       auto const& ext_src = external_sources.const_array(mfi);

       amrex::ParallelFor(bx, [snew, sold, adv, ext_src, dt, first_scalar, last_scalar]
       AMREX_GPU_DEVICE (int i, int j, int k) noexcept
       {
           for (int n = first_scalar; n <= last_scalar; n++) {
               snew(i,j,k,n) = sold(i,j,k,n) + dt * (adv(i,j,k,n) + ext_src(i,j,k,n));
           }
       });
   }

   // Let's FillPatch the new class state density, so that it's ready for anyone using it further down in the SDC ite.
   FillPatch(*this,S_new,S_new.nGrow(),new_time,State_Type,Density,1,Density);
}